

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3FixSelect(DbFixer *pFix,Select *pSelect)

{
  ExprList *pEVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  ExprList_item *pEVar6;
  long lVar7;
  long lVar8;
  
  if (pSelect != (Select *)0x0) {
    do {
      pEVar1 = pSelect->pEList;
      if ((pEVar1 != (ExprList *)0x0) && (0 < pEVar1->nExpr)) {
        pEVar6 = pEVar1->a;
        iVar5 = 0;
        do {
          iVar3 = sqlite3FixExpr(pFix,pEVar6->pExpr);
          if (iVar3 != 0) {
            return 1;
          }
          iVar5 = iVar5 + 1;
          pEVar6 = pEVar6 + 1;
        } while (iVar5 < pEVar1->nExpr);
      }
      iVar5 = sqlite3FixSrcList(pFix,pSelect->pSrc);
      if (iVar5 != 0) {
        return 1;
      }
      iVar5 = sqlite3FixExpr(pFix,pSelect->pWhere);
      if (iVar5 != 0) {
        return 1;
      }
      pEVar1 = pSelect->pGroupBy;
      if ((pEVar1 != (ExprList *)0x0) && (0 < pEVar1->nExpr)) {
        pEVar6 = pEVar1->a;
        iVar5 = 0;
        do {
          iVar3 = sqlite3FixExpr(pFix,pEVar6->pExpr);
          if (iVar3 != 0) {
            return 1;
          }
          iVar5 = iVar5 + 1;
          pEVar6 = pEVar6 + 1;
        } while (iVar5 < pEVar1->nExpr);
      }
      iVar5 = sqlite3FixExpr(pFix,pSelect->pHaving);
      if (iVar5 != 0) {
        return 1;
      }
      pEVar1 = pSelect->pOrderBy;
      if ((pEVar1 != (ExprList *)0x0) && (0 < pEVar1->nExpr)) {
        pEVar6 = pEVar1->a;
        iVar5 = 0;
        do {
          iVar3 = sqlite3FixExpr(pFix,pEVar6->pExpr);
          if (iVar3 != 0) {
            return 1;
          }
          iVar5 = iVar5 + 1;
          pEVar6 = pEVar6 + 1;
        } while (iVar5 < pEVar1->nExpr);
      }
      iVar5 = sqlite3FixExpr(pFix,pSelect->pLimit);
      if (iVar5 != 0) {
        return 1;
      }
      if (pSelect->pWith != (With *)0x0) {
        iVar5 = pSelect->pWith->nCte;
        bVar2 = 0 < iVar5;
        if (0 < iVar5) {
          iVar5 = sqlite3FixSelect(pFix,pSelect->pWith->a[0].pSelect);
          if (iVar5 == 0) {
            lVar7 = 0x40;
            lVar8 = 0;
            do {
              lVar8 = lVar8 + 1;
              lVar4 = (long)pSelect->pWith->nCte;
              bVar2 = lVar8 < lVar4;
              if (lVar4 <= lVar8) goto LAB_0019f32d;
              lVar4 = lVar7 + -0x10;
              lVar7 = lVar7 + 0x20;
              iVar5 = sqlite3FixSelect(pFix,*(Select **)((long)pSelect->pWith->a + lVar4));
            } while (iVar5 == 0);
          }
          if (bVar2) {
            return 1;
          }
        }
      }
LAB_0019f32d:
      pSelect = pSelect->pPrior;
    } while (pSelect != (Select *)0x0);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3FixSelect(
  DbFixer *pFix,       /* Context of the fixation */
  Select *pSelect      /* The SELECT statement to be fixed to one database */
){
  while( pSelect ){
    if( sqlite3FixExprList(pFix, pSelect->pEList) ){
      return 1;
    }
    if( sqlite3FixSrcList(pFix, pSelect->pSrc) ){
      return 1;
    }
    if( sqlite3FixExpr(pFix, pSelect->pWhere) ){
      return 1;
    }
    if( sqlite3FixExprList(pFix, pSelect->pGroupBy) ){
      return 1;
    }
    if( sqlite3FixExpr(pFix, pSelect->pHaving) ){
      return 1;
    }
    if( sqlite3FixExprList(pFix, pSelect->pOrderBy) ){
      return 1;
    }
    if( sqlite3FixExpr(pFix, pSelect->pLimit) ){
      return 1;
    }
    if( pSelect->pWith ){
      int i;
      for(i=0; i<pSelect->pWith->nCte; i++){
        if( sqlite3FixSelect(pFix, pSelect->pWith->a[i].pSelect) ){
          return 1;
        }
      }
    }
    pSelect = pSelect->pPrior;
  }
  return 0;
}